

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_inkey(ui_event *ch,_Bool wait,_Bool take)

{
  uint8_t uVar1;
  ushort uVar2;
  ui_event *puVar3;
  mouseclick mVar4;
  term *ptVar5;
  errr eVar6;
  uint16_t uVar7;
  uint uVar8;
  
  *(undefined4 *)&(ch->key).mods = 0;
  *(ui_event_type *)ch = EVT_NONE;
  *(uint8_t *)((long)ch + 4) = '\0';
  *(uint8_t *)((long)ch + 5) = '\0';
  *(uint8_t *)((long)ch + 6) = '\0';
  *(uint8_t *)((long)ch + 7) = '\0';
  if ((Term->never_bored == false) && (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
    (*Term->xtra_hook)(L'\t',L'\0');
  }
  if (wait) {
    if (Term->key_head == Term->key_tail) {
      do {
        if (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0) {
          (*Term->xtra_hook)(L'\x01',L'\x01');
        }
      } while (Term->key_head == Term->key_tail);
    }
  }
  else if ((Term->key_head == Term->key_tail) &&
          (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
    (*Term->xtra_hook)(L'\x01',L'\0');
  }
  ptVar5 = Term;
  uVar2 = Term->key_tail;
  eVar6 = 1;
  if (Term->key_head != uVar2) {
    puVar3 = Term->key_queue;
    *(undefined4 *)&(ch->key).mods = *(undefined4 *)((long)puVar3 + (ulong)uVar2 * 0xc + 8);
    mVar4 = puVar3[uVar2].mouse;
    ch->mouse = mVar4;
    if ((ulong)mVar4 >> 0x20 != 0 && mVar4.type == EVT_KBRD) {
      uVar1 = (ch->key).mods;
      *(mouseclick *)(keylog + log_i) = mVar4;
      keylog[log_i].mods = uVar1;
      if (log_size < L'\b') {
        log_size = log_size + L'\x01';
      }
      uVar8 = log_i + L'\b';
      if (-1 < log_i + L'\x01') {
        uVar8 = log_i + L'\x01';
      }
      log_i = (log_i - (uVar8 & 0xfffffff8)) + L'\x01';
    }
    eVar6 = 0;
    if (take) {
      uVar7 = ptVar5->key_tail + 1;
      eVar6 = 0;
      if (uVar7 == ptVar5->key_size) {
        uVar7 = 0;
      }
      ptVar5->key_tail = uVar7;
    }
  }
  return eVar6;
}

Assistant:

errr Term_inkey(ui_event *ch, bool wait, bool take)
{
	/* Assume no key */
	memset(ch, 0, sizeof *ch);

	/* Hack -- get bored */
	if (!Term->never_bored)
		/* Process random events */
		Term_xtra(TERM_XTRA_BORED, 0);

	/* Wait or not */
	if (wait)
		/* Process pending events while necessary */
		while (Term->key_head == Term->key_tail)
			/* Process events (wait for one) */
			Term_xtra(TERM_XTRA_EVENT, true);
	else
		/* Process pending events if necessary */
		if (Term->key_head == Term->key_tail)
			/* Process events (do not wait) */
			Term_xtra(TERM_XTRA_EVENT, false);

	/* No keys are ready */
	if (Term->key_head == Term->key_tail) return (1);

	/* Extract the next keypress */
	(*ch) = Term->key_queue[Term->key_tail];

	/* sketchy key loggin */
	log_keypress(*ch);

	/* If requested, advance the queue, wrap around if necessary */
	if (take && (++Term->key_tail == Term->key_size)) Term->key_tail = 0;

	/* Success */
	return (0);
}